

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O0

size_t rtosc::path_search(Ports *root,char *m,size_t max_ports,char *msgbuf,size_t bufsize,
                         path_search_opts opts,bool reply_with_query)

{
  path_search_opts pVar1;
  byte bVar2;
  size_t sVar3;
  long lVar4;
  rtosc_arg_t rVar5;
  long alStackY_d0 [2];
  path_search_opts apStackY_c0 [2];
  uint auStackY_b8 [2];
  undefined8 uStackY_b0;
  long local_a8;
  long local_a0;
  undefined8 in_stack_ffffffffffffff68;
  uint idx;
  size_t length;
  unsigned_long __vla_expr1;
  unsigned_long __vla_expr0;
  size_t max_types;
  size_t max_args;
  char *needle;
  char *local_48 [2];
  char *str;
  bool reply_with_query_local;
  size_t sStack_30;
  path_search_opts opts_local;
  size_t bufsize_local;
  char *msgbuf_local;
  size_t max_ports_local;
  char *m_local;
  Ports *root_local;
  
  str._3_1_ = reply_with_query;
  uStackY_b0 = 0x1089b6;
  idx = (uint)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  str._4_4_ = opts;
  sStack_30 = bufsize;
  bufsize_local = (size_t)msgbuf;
  msgbuf_local = (char *)max_ports;
  max_ports_local = (size_t)m;
  m_local = (char *)root;
  rVar5 = rtosc_argument((char *)length,idx);
  needle = rVar5._0_8_;
  local_48[1] = needle;
  uStackY_b0 = 0x1089d4;
  rtosc_argument((char *)length,idx);
  pVar1 = str._4_4_;
  local_a8 = (long)&local_a8 - ((long)msgbuf_local * 2 + 0x10U & 0xfffffffffffffff0);
  lVar4 = local_a8 + (long)msgbuf_local * -0x20;
  local_a0 = lVar4;
  bVar2 = str._3_1_ & 1;
  *(long *)(lVar4 + -0x20) = (long)msgbuf_local * 2;
  *(path_search_opts *)(lVar4 + -0x18) = pVar1;
  *(uint *)(lVar4 + -0x10) = (uint)bVar2;
  *(undefined8 *)(lVar4 + -0x28) = 0x108a7c;
  path_search(*(Ports **)(lVar4 + 200),*(char **)(lVar4 + 0xc0),*(char **)(lVar4 + 0xb8),
              *(char **)(lVar4 + 0xb0),*(size_t *)(lVar4 + 0xa8),*(rtosc_arg_t **)(lVar4 + 0xa0),
              *(size_t *)(lVar4 + 0xd8),*(path_search_opts *)(lVar4 + 0xe0),*(bool *)(lVar4 + 0x9f))
  ;
  *(undefined8 *)(lVar4 + -8) = 0x108aa2;
  sVar3 = rtosc_amessage(*(char **)(lVar4 + 0x80),*(size_t *)(lVar4 + 0x78),*(char **)(lVar4 + 0x70)
                         ,*(char **)(lVar4 + 0x68),*(rtosc_arg_t **)(lVar4 + 0x60));
  return sVar3;
}

Assistant:

std::size_t rtosc::path_search(const Ports &root, const char *m,
                               std::size_t max_ports,
                               char *msgbuf, std::size_t bufsize,
                               path_search_opts opts, bool reply_with_query)
{
    const char *str    = rtosc_argument(m,0).s;
    const char *needle = rtosc_argument(m,1).s;
    size_t max_args    = max_ports << 1;
    size_t max_types   = max_args + 1;
    STACKALLOC(char, types, max_types);
    STACKALLOC(rtosc_arg_t, args, max_args);

    path_search(root, str, needle, types, max_types, args, max_args, opts, reply_with_query);
    size_t length = rtosc_amessage(msgbuf, bufsize,
                                   "/paths", types, args);
    return length;
}